

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_reflection.cc
# Opt level: O0

void google::protobuf::internal::RegisterAllTypesInternal(Metadata *file_level_metadata,int size)

{
  GeneratedMessageReflection *reflection;
  int i;
  int size_local;
  Metadata *file_level_metadata_local;
  
  for (reflection._0_4_ = 0; (int)reflection < size; reflection._0_4_ = (int)reflection + 1) {
    if (file_level_metadata[(int)reflection].reflection != (Reflection *)0x0) {
      MessageFactory::InternalRegisterGeneratedMessage
                (file_level_metadata[(int)reflection].descriptor,
                 (Message *)file_level_metadata[(int)reflection].reflection[2]._vptr_Reflection);
    }
  }
  return;
}

Assistant:

void RegisterAllTypesInternal(const Metadata* file_level_metadata, int size) {
  for (int i = 0; i < size; i++) {
    const GeneratedMessageReflection* reflection =
        static_cast<const GeneratedMessageReflection*>(
           file_level_metadata[i].reflection);
    if (reflection) {
      // It's not a map type
      ::google::protobuf::MessageFactory::InternalRegisterGeneratedMessage(
          file_level_metadata[i].descriptor,
          reflection->schema_.default_instance_);
    }
  }
}